

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O2

void Dsd_TreeNodeGetInfo(Dsd_Manager_t *pDsdMan,int *DepthMax,int *GateSizeMax)

{
  long lVar1;
  
  s_DepthMax = 0;
  s_GateSizeMax = 0;
  for (lVar1 = 0; lVar1 < pDsdMan->nRoots; lVar1 = lVar1 + 1) {
    Dsd_TreeGetInfo_rec((Dsd_Node_t *)((ulong)pDsdMan->pRoots[lVar1] & 0xfffffffffffffffe),0);
  }
  if (DepthMax != (int *)0x0) {
    *DepthMax = s_DepthMax;
  }
  if (GateSizeMax != (int *)0x0) {
    *GateSizeMax = s_GateSizeMax;
  }
  return;
}

Assistant:

void Dsd_TreeNodeGetInfo( Dsd_Manager_t * pDsdMan, int * DepthMax, int * GateSizeMax )
{
    int i;
    s_DepthMax    = 0;
    s_GateSizeMax = 0;

    for ( i = 0; i < pDsdMan->nRoots; i++ )
        Dsd_TreeGetInfo_rec( Dsd_Regular( pDsdMan->pRoots[i] ), 0 );

    if ( DepthMax ) 
        *DepthMax     = s_DepthMax;
    if ( GateSizeMax ) 
        *GateSizeMax  = s_GateSizeMax;
}